

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateUniformBlockNameLengthContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  TestCaseGroup *targetGroup_00;
  TestCaseGroup *parentStructure_00;
  SharedPtr *context_00;
  NodeType NVar1;
  Node *pNVar2;
  bool local_82;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  bool local_22;
  byte local_21;
  bool namedNonArrayBlock;
  TestCaseGroup *pTStack_20;
  bool isInterfaceBlock;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  pTStack_20 = targetGroup;
  targetGroup_local = (TestCaseGroup *)parentStructure;
  parentStructure_local = (SharedPtr *)context;
  pNVar2 = de::
           SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
           ::operator->(parentStructure);
  NVar1 = ResourceDefinition::Node::getType(pNVar2);
  local_21 = NVar1 == TYPE_INTERFACE_BLOCK;
  local_82 = false;
  if ((bool)local_21) {
    pNVar2 = de::
             SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             ::get((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                    *)targetGroup_local);
    local_82 = false;
    if (((ulong)pNVar2[1]._vptr_Node & 1) != 0) {
      pNVar2 = de::
               SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               ::operator->((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                             *)targetGroup_local);
      pNVar2 = ResourceDefinition::Node::getEnclosingNode(pNVar2);
      NVar1 = ResourceDefinition::Node::getType(pNVar2);
      local_82 = NVar1 != TYPE_ARRAY_ELEMENT;
    }
  }
  context_00 = parentStructure_local;
  parentStructure_00 = targetGroup_local;
  targetGroup_00 = pTStack_20;
  local_22 = local_82;
  if (((local_21 & 1) == 0) || (local_82 != false)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
    generateBufferBackedVariableAggregateTypeCases
              ((Context *)context_00,(SharedPtr *)parentStructure_00,targetGroup_00,
               PROGRAMINTERFACE_UNIFORM,PROGRAMRESOURCEPROP_NAME_LENGTH,TYPE_FLOAT,&local_48,2);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_81);
    generateBufferBackedVariableAggregateTypeCases
              ((Context *)context_00,(SharedPtr *)parentStructure_00,targetGroup_00,
               PROGRAMINTERFACE_UNIFORM,PROGRAMRESOURCEPROP_NAME_LENGTH,TYPE_FLOAT,&local_80,1);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  return;
}

Assistant:

static void generateUniformBlockNameLengthContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const bool	isInterfaceBlock	= (parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);
	const bool	namedNonArrayBlock	= isInterfaceBlock																					&&
									  static_cast<const ResourceDefinition::InterfaceBlock*>(parentStructure.get())->m_named			&&
									  parentStructure->getEnclosingNode()->getType() != ResourceDefinition::Node::TYPE_ARRAY_ELEMENT;

	if (!isInterfaceBlock || namedNonArrayBlock)
		generateBufferBackedVariableAggregateTypeCases(context, parentStructure, targetGroup, PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_NAME_LENGTH, glu::TYPE_FLOAT, "", 2);
	else
		generateBufferBackedVariableAggregateTypeCases(context, parentStructure, targetGroup, PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_NAME_LENGTH, glu::TYPE_FLOAT, "", 1);
}